

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall
stringToUnits_ParseIssues_Test::stringToUnits_ParseIssues_Test(stringToUnits_ParseIssues_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0022a670;
  return;
}

Assistant:

TEST(stringToUnits, ParseIssues)
{
    auto u1 = unit_from_string("Metres");
    EXPECT_EQ(u1, precise::m);

    u1 = unit_from_string("degrees C");
    EXPECT_EQ(u1, precise::degC);

#if !defined(UNITS_DISABLE_NON_ENGLISH_UNITS) ||                               \
    UNITS_DISABLE_NON_ENGLISH_UNITS == 0
    u1 = unit_from_string("gramm");
    EXPECT_EQ(u1, precise::g);
    u1 = unit_from_string("kilogramm");
    EXPECT_EQ(u1, precise::kilo * precise::g);
#else
    u1 = unit_from_string("gramm");
    EXPECT_EQ(u1, precise::g * precise::m);
    u1 = unit_from_string("kilogramm");
    EXPECT_EQ(u1, precise::kilo * precise::g * precise::m);
#endif

    u1 = unit_from_string("inchy");
    EXPECT_FALSE(is_valid(u1));

    u1 = unit_from_string("fln_oz");
    EXPECT_FALSE(is_valid(u1));

    u1 = unit_from_string("wattm");
    EXPECT_EQ(u1, precise::W * precise::m);

    u1 = unit_from_string("British Thermal Unit");
    EXPECT_EQ(u1, precise::btu);
}